

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O1

int run_test_loop_instant_close(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001abafc;
    }
  }
  else {
    run_test_loop_instant_close_cold_1();
  }
  run_test_loop_instant_close_cold_2();
LAB_001abafc:
  run_test_loop_instant_close_cold_3();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_instant_close) {
  static uv_loop_t loop;
  static uv_work_t req;
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_queue_work(&loop,
                          &req,
                          loop_instant_close_work_cb,
                          loop_instant_close_after_work_cb));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}